

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O2

int __thiscall Fl_Slider::scrollvalue(Fl_Slider *this,int pos,int size,int first,int total)

{
  int iVar1;
  double v;
  
  (this->super_Fl_Valuator).A = 1.0;
  (this->super_Fl_Valuator).B = 1;
  iVar1 = (size + pos) - first;
  if (size + pos <= total + first) {
    iVar1 = total;
  }
  if (size < iVar1) {
    v = (double)size / (double)iVar1;
  }
  else {
    v = 1.0;
  }
  slider_size(this,v);
  bounds(this,(double)first,(double)((first - size) + iVar1));
  iVar1 = Fl_Valuator::value(&this->super_Fl_Valuator,(double)pos);
  return iVar1;
}

Assistant:

int Fl_Slider::scrollvalue(int pos, int size, int first, int total) {
  step(1, 1);
  if (pos+size > first+total) total = pos+size-first;
  slider_size(size >= total ? 1.0 : double(size)/double(total));
  bounds(first, total-size+first);
  return value(pos);
}